

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcCurveBoundedPlane::~IfcCurveBoundedPlane(IfcCurveBoundedPlane *this)

{
  _func_int *p_Var1;
  _func_int *p_Var2;
  void *pvVar3;
  
  p_Var2 = (this->super_IfcBoundedSurface).super_IfcSurface.super_IfcGeometricRepresentationItem.
           super_IfcRepresentationItem.
           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
           _vptr_ObjectHelper[0xfffffffffffffffd];
  p_Var1 = (_func_int *)
           ((long)&(this->super_IfcBoundedSurface).super_IfcSurface.
                   super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
                   super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                   _vptr_ObjectHelper + (long)p_Var2);
  *(undefined ***)
   ((long)&(this->super_IfcBoundedSurface).super_IfcSurface.super_IfcGeometricRepresentationItem.
           super_IfcRepresentationItem.
           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
           _vptr_ObjectHelper + (long)p_Var2) = &PTR__IfcCurveBoundedPlane_0087fd50;
  *(undefined ***)(&this->field_0x78 + (long)p_Var2) = &PTR__IfcCurveBoundedPlane_0087fe18;
  *(undefined ***)
   (&(this->super_IfcBoundedSurface).super_IfcSurface.super_IfcGeometricRepresentationItem.
     super_IfcRepresentationItem.
     super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 +
   (long)p_Var2) = &PTR__IfcCurveBoundedPlane_0087fd78;
  *(undefined ***)
   (&(this->super_IfcBoundedSurface).super_IfcSurface.super_IfcGeometricRepresentationItem.
     super_IfcRepresentationItem.
     super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 +
   (long)p_Var2) = &PTR__IfcCurveBoundedPlane_0087fda0;
  *(undefined ***)
   (&(this->super_IfcBoundedSurface).super_IfcSurface.super_IfcGeometricRepresentationItem.
     field_0x30 + (long)p_Var2) = &PTR__IfcCurveBoundedPlane_0087fdc8;
  *(undefined ***)(&(this->super_IfcBoundedSurface).super_IfcSurface.field_0x40 + (long)p_Var2) =
       &PTR__IfcCurveBoundedPlane_0087fdf0;
  pvVar3 = *(void **)((long)&(this->InnerBoundaries).
                             super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>_>_>
                             .
                             super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + (long)p_Var2);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,*(long *)(p_Var1 + 0x70) - (long)pvVar3);
  }
  operator_delete(p_Var1,0x90);
  return;
}

Assistant:

IfcCurveBoundedPlane() : Object("IfcCurveBoundedPlane") {}